

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ModuleHeaderSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ModuleHeaderSyntax,slang::syntax::ModuleHeaderSyntax_const&>
          (BumpAllocator *this,ModuleHeaderSyntax *args)

{
  SyntaxNode *pSVar1;
  Info *pIVar2;
  Info *pIVar3;
  Info *pIVar4;
  size_t sVar5;
  PortListSyntax *pPVar6;
  undefined4 uVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  TokenKind TVar11;
  undefined1 uVar12;
  NumericTokenFlags NVar13;
  uint32_t uVar14;
  TokenKind TVar15;
  undefined1 uVar16;
  NumericTokenFlags NVar17;
  uint32_t uVar18;
  ModuleHeaderSyntax *pMVar19;
  
  pMVar19 = (ModuleHeaderSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ModuleHeaderSyntax *)this->endPtr < pMVar19 + 1) {
    pMVar19 = (ModuleHeaderSyntax *)allocateSlow(this,0xa0,8);
  }
  else {
    this->head->current = (byte *)(pMVar19 + 1);
  }
  (pMVar19->super_SyntaxNode).previewNode = (args->super_SyntaxNode).previewNode;
  uVar7 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  (pMVar19->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pMVar19->super_SyntaxNode).field_0x4 = uVar7;
  (pMVar19->super_SyntaxNode).parent = pSVar1;
  uVar8 = (args->moduleKeyword).field_0x2;
  NVar9.raw = (args->moduleKeyword).numFlags.raw;
  uVar10 = (args->moduleKeyword).rawLen;
  pIVar2 = (args->moduleKeyword).info;
  TVar11 = (args->lifetime).kind;
  uVar12 = (args->lifetime).field_0x2;
  NVar13.raw = (args->lifetime).numFlags.raw;
  uVar14 = (args->lifetime).rawLen;
  pIVar3 = (args->lifetime).info;
  TVar15 = (args->name).kind;
  uVar16 = (args->name).field_0x2;
  NVar17.raw = (args->name).numFlags.raw;
  uVar18 = (args->name).rawLen;
  pIVar4 = (args->name).info;
  (pMVar19->moduleKeyword).kind = (args->moduleKeyword).kind;
  (pMVar19->moduleKeyword).field_0x2 = uVar8;
  (pMVar19->moduleKeyword).numFlags = (NumericTokenFlags)NVar9.raw;
  (pMVar19->moduleKeyword).rawLen = uVar10;
  (pMVar19->moduleKeyword).info = pIVar2;
  (pMVar19->lifetime).kind = TVar11;
  (pMVar19->lifetime).field_0x2 = uVar12;
  (pMVar19->lifetime).numFlags = (NumericTokenFlags)NVar13.raw;
  (pMVar19->lifetime).rawLen = uVar14;
  (pMVar19->lifetime).info = pIVar3;
  (pMVar19->name).kind = TVar15;
  (pMVar19->name).field_0x2 = uVar16;
  (pMVar19->name).numFlags = (NumericTokenFlags)NVar17.raw;
  (pMVar19->name).rawLen = uVar18;
  (pMVar19->name).info = pIVar4;
  uVar7 = *(undefined4 *)&(args->imports).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->imports).super_SyntaxListBase.super_SyntaxNode.parent;
  (pMVar19->imports).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->imports).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pMVar19->imports).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar7;
  (pMVar19->imports).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pMVar19->imports).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->imports).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pMVar19->imports).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005b7e60;
  (pMVar19->imports).super_SyntaxListBase.childCount =
       (args->imports).super_SyntaxListBase.childCount;
  sVar5 = (args->imports).
          super_span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  (pMVar19->imports).
  super_span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->imports).
       super_span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL>._M_ptr;
  (pMVar19->imports).
  super_span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar5;
  (pMVar19->imports).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005bbb60;
  pPVar6 = args->ports;
  TVar11 = (args->semi).kind;
  uVar8 = (args->semi).field_0x2;
  NVar9.raw = (args->semi).numFlags.raw;
  uVar10 = (args->semi).rawLen;
  pIVar2 = (args->semi).info;
  pMVar19->parameters = args->parameters;
  pMVar19->ports = pPVar6;
  (pMVar19->semi).kind = TVar11;
  (pMVar19->semi).field_0x2 = uVar8;
  (pMVar19->semi).numFlags = (NumericTokenFlags)NVar9.raw;
  (pMVar19->semi).rawLen = uVar10;
  (pMVar19->semi).info = pIVar2;
  return pMVar19;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }